

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_write_sot(opj_j2k_t *p_j2k,OPJ_BYTE *p_data,OPJ_UINT32 p_total_data_size,
                          OPJ_UINT32 *p_data_written,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1077,
                  "OPJ_BOOL opj_j2k_write_sot(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, OPJ_UINT32 *, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_stream != (opj_stream_private_t *)0x0) {
      if (0xb < p_total_data_size) {
        opj_write_bytes_LE(p_data,0xff90,2);
        opj_write_bytes_LE(p_data + 2,10,2);
        opj_write_bytes_LE(p_data + 4,p_j2k->m_current_tile_number,2);
        opj_write_bytes_LE(p_data + 10,
                           (p_j2k->m_specific_param).m_encoder.m_current_tile_part_number,1);
        opj_write_bytes_LE(p_data + 0xb,
                           (p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].m_nb_tile_parts,1);
        *p_data_written = 0xc;
      }
      else {
        opj_event_msg(p_manager,1,"Not enough bytes in output buffer to write SOT marker\n");
      }
      return (uint)(0xb < p_total_data_size);
    }
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1079,
                  "OPJ_BOOL opj_j2k_write_sot(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, OPJ_UINT32 *, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x1078,
                "OPJ_BOOL opj_j2k_write_sot(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, OPJ_UINT32 *, const opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_sot(opj_j2k_t *p_j2k,
                                  OPJ_BYTE * p_data,
                                  OPJ_UINT32 p_total_data_size,
                                  OPJ_UINT32 * p_data_written,
                                  const opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager
                                 )
{
    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_stream);

    if (p_total_data_size < 12) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough bytes in output buffer to write SOT marker\n");
        return OPJ_FALSE;
    }

    opj_write_bytes(p_data, J2K_MS_SOT,
                    2);                                 /* SOT */
    p_data += 2;

    opj_write_bytes(p_data, 10,
                    2);                                                   /* Lsot */
    p_data += 2;

    opj_write_bytes(p_data, p_j2k->m_current_tile_number,
                    2);                        /* Isot */
    p_data += 2;

    /* Psot  */
    p_data += 4;

    opj_write_bytes(p_data,
                    p_j2k->m_specific_param.m_encoder.m_current_tile_part_number,
                    1);                        /* TPsot */
    ++p_data;

    opj_write_bytes(p_data,
                    p_j2k->m_cp.tcps[p_j2k->m_current_tile_number].m_nb_tile_parts,
                    1);                      /* TNsot */
    ++p_data;

    /* UniPG>> */
#ifdef USE_JPWL
    /* update markers struct */
    /*
            OPJ_BOOL res = j2k_add_marker(p_j2k->cstr_info, J2K_MS_SOT, p_j2k->sot_start, len + 2);
    */
    assert(0 && "TODO");
#endif /* USE_JPWL */

    * p_data_written = 12;

    return OPJ_TRUE;
}